

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam.c
# Opt level: O0

void la_miam_file_transfer_request_format_text(la_vstring *vstr,void *data,int indent)

{
  uint uVar1;
  char *pcVar2;
  int in_EDX;
  undefined8 *in_RSI;
  la_vstring *in_RDI;
  tm *t;
  la_miam_file_transfer_request_msg *msg;
  
  uVar1 = in_EDX + 1;
  la_vstring_append_sprintf
            (in_RDI,"%*sFile ID: %u\n",(ulong)uVar1,"",(ulong)*(ushort *)(in_RSI + 1));
  la_vstring_append_sprintf(in_RDI,"%*sFile size: %zu bytes\n",(ulong)uVar1,"",*in_RSI);
  la_vstring_append_sprintf
            (in_RDI,"%*sComplete until: %d-%02d-%02d %02d:%02d:%02d\n",(ulong)uVar1,"",
             (ulong)(*(int *)((long)in_RSI + 0x24) + 0x76c),(ulong)(*(int *)(in_RSI + 4) + 1),
             *(undefined4 *)((long)in_RSI + 0x1c),*(undefined4 *)(in_RSI + 3),
             *(undefined4 *)((long)in_RSI + 0x14),*(undefined4 *)(in_RSI + 2));
  pcVar2 = la_reasm_status_name_get(*(la_reasm_status *)(in_RSI + 9));
  la_vstring_append_sprintf(in_RDI,"%*sReassembly: %s\n",(ulong)uVar1,"",pcVar2);
  return;
}

Assistant:

static void la_miam_file_transfer_request_format_text(la_vstring *vstr, void const *data, int indent) {
	la_assert(vstr);
	la_assert(data);
	la_assert(indent >= 0);

	la_miam_file_transfer_request_msg const *msg = data;
	indent++;
	LA_ISPRINTF(vstr, indent, "File ID: %u\n", msg->file_id);
	LA_ISPRINTF(vstr, indent, "File size: %zu bytes\n", msg->file_size);
	struct tm const *t = &msg->validity_time;
	LA_ISPRINTF(vstr, indent, "Complete until: %d-%02d-%02d %02d:%02d:%02d\n",
			t->tm_year + 1900, t->tm_mon + 1, t->tm_mday,
			t->tm_hour, t->tm_min, t->tm_sec
			);
	LA_ISPRINTF(vstr, indent, "Reassembly: %s\n", la_reasm_status_name_get(msg->reasm_status));
}